

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::PosixRandomAccessFile
          (PosixRandomAccessFile *this,string *filename,int fd,Limiter *fd_limiter)

{
  bool bVar1;
  int local_54;
  Limiter *fd_limiter_local;
  int fd_local;
  string *filename_local;
  PosixRandomAccessFile *this_local;
  
  RandomAccessFile::RandomAccessFile(&this->super_RandomAccessFile);
  (this->super_RandomAccessFile)._vptr_RandomAccessFile =
       (_func_int **)&PTR__PosixRandomAccessFile_00169b60;
  bVar1 = Limiter::Acquire(fd_limiter);
  this->has_permanent_fd_ = bVar1;
  local_54 = fd;
  if ((this->has_permanent_fd_ & 1U) == 0) {
    local_54 = -1;
  }
  this->fd_ = local_54;
  this->fd_limiter_ = fd_limiter;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  if ((this->has_permanent_fd_ & 1U) == 0) {
    if (this->fd_ != -1) {
      __assert_fail("fd_ == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                    ,0x9e,
                    "leveldb::(anonymous namespace)::PosixRandomAccessFile::PosixRandomAccessFile(std::string, int, Limiter *)"
                   );
    }
    close(fd);
  }
  return;
}

Assistant:

PosixRandomAccessFile(std::string filename, int fd, Limiter* fd_limiter)
      : has_permanent_fd_(fd_limiter->Acquire()),
        fd_(has_permanent_fd_ ? fd : -1),
        fd_limiter_(fd_limiter),
        filename_(std::move(filename)) {
    if (!has_permanent_fd_) {
      assert(fd_ == -1);
      ::close(fd);  // The file will be opened on every read.
    }
  }